

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChClassFactory.h
# Opt level: O1

void __thiscall
chrono::ChClassRegistration<chrono::ChLinkRSDA>::ChClassRegistration
          (ChClassRegistration<chrono::ChLinkRSDA> *this,char *mtag_name)

{
  ChClassFactory *this_00;
  
  (this->super_ChClassRegistrationBase)._vptr_ChClassRegistrationBase =
       (_func_int **)&PTR_create_00b42768;
  (this->m_sTagName)._M_dataplus._M_p = (pointer)&(this->m_sTagName).field_2;
  (this->m_sTagName)._M_string_length = 0;
  (this->m_sTagName).field_2._M_local_buf[0] = '\0';
  strlen(mtag_name);
  std::__cxx11::string::_M_replace((ulong)&this->m_sTagName,0,(char *)0x0,(ulong)mtag_name);
  this_00 = ChClassFactory::GetGlobalClassFactory();
  ChClassFactory::_ClassRegister(this_00,&this->m_sTagName,&this->super_ChClassRegistrationBase);
  return;
}

Assistant:

ChClassRegistration(const char* mtag_name) {
        // set name using the 'fake' RTTI system of Chrono
        this->m_sTagName = mtag_name; //t::FactoryClassNameTag();

        // register in global class factory
        ChClassFactory::ClassRegister(this->m_sTagName, this);
    }